

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FieldDescriptorProto::Clear(FieldDescriptorProto *this)

{
  byte bVar1;
  string *psVar2;
  char cVar3;
  uint uVar4;
  
  bVar1 = (byte)this->_has_bits_[0];
  uVar4 = (uint)bVar1;
  if (bVar1 != 0) {
    if (((bVar1 & 1) != 0) &&
       (psVar2 = this->name_, psVar2 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
      uVar4 = this->_has_bits_[0];
    }
    this->number_ = 0;
    this->label_ = 1;
    this->type_ = 1;
    if (((uVar4 & 0x10) != 0) &&
       (psVar2 = this->type_name_, psVar2 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
      uVar4 = this->_has_bits_[0];
    }
    if (((uVar4 & 0x20) != 0) &&
       (psVar2 = this->extendee_, psVar2 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
      uVar4 = this->_has_bits_[0];
    }
    cVar3 = (char)uVar4;
    if (((uVar4 & 0x40) != 0) &&
       (psVar2 = this->default_value_, psVar2 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
      cVar3 = (char)this->_has_bits_[0];
    }
    if ((cVar3 < '\0') && (this->options_ != (FieldOptions *)0x0)) {
      FieldOptions::Clear(this->options_);
    }
  }
  this->_has_bits_[0] = 0;
  UnknownFieldSet::Clear(&this->_unknown_fields_);
  return;
}

Assistant:

void FieldDescriptorProto::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_name()) {
      if (name_ != &::google::protobuf::internal::kEmptyString) {
        name_->clear();
      }
    }
    number_ = 0;
    label_ = 1;
    type_ = 1;
    if (has_type_name()) {
      if (type_name_ != &::google::protobuf::internal::kEmptyString) {
        type_name_->clear();
      }
    }
    if (has_extendee()) {
      if (extendee_ != &::google::protobuf::internal::kEmptyString) {
        extendee_->clear();
      }
    }
    if (has_default_value()) {
      if (default_value_ != &::google::protobuf::internal::kEmptyString) {
        default_value_->clear();
      }
    }
    if (has_options()) {
      if (options_ != NULL) options_->::google::protobuf::FieldOptions::Clear();
    }
  }
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}